

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanLogicalDevice.cpp
# Opt level: O3

SamplerWrapper * __thiscall
VulkanUtilities::VulkanLogicalDevice::CreateSampler
          (SamplerWrapper *__return_storage_ptr__,VulkanLogicalDevice *this,
          VkSamplerCreateInfo *SamplerCI,char *DebugName)

{
  string msg;
  string local_48;
  
  if (SamplerCI->sType != VK_STRUCTURE_TYPE_SAMPLER_CREATE_INFO) {
    Diligent::FormatString<char[26],char[57]>
              (&local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"SamplerCI.sType == VK_STRUCTURE_TYPE_SAMPLER_CREATE_INFO",
               (char (*) [57])DebugName);
    Diligent::DebugAssertionFailed
              (local_48._M_dataplus._M_p,"CreateSampler",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanLogicalDevice.cpp"
               ,0xda);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  CreateVulkanObject<VkSampler_T*,(VulkanUtilities::VulkanHandleTypeId)12,VkResult(*)(VkDevice_T*,VkSamplerCreateInfo_const*,VkAllocationCallbacks_const*,VkSampler_T**),VkSamplerCreateInfo>
            (__return_storage_ptr__,this,
             (_func_VkResult_VkDevice_T_ptr_VkSamplerCreateInfo_ptr_VkAllocationCallbacks_ptr_VkSampler_T_ptr_ptr
              *)vkCreateSampler,SamplerCI,DebugName,"sampler");
  return __return_storage_ptr__;
}

Assistant:

SamplerWrapper VulkanLogicalDevice::CreateSampler(const VkSamplerCreateInfo& SamplerCI, const char* DebugName) const
{
    VERIFY_EXPR(SamplerCI.sType == VK_STRUCTURE_TYPE_SAMPLER_CREATE_INFO);
    return CreateVulkanObject<VkSampler, VulkanHandleTypeId::Sampler>(vkCreateSampler, SamplerCI, DebugName, "sampler");
}